

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

ostream * despot::operator<<(ostream *os,NamedVar *var)

{
  pointer pbVar1;
  ostream *poVar2;
  long lVar3;
  ulong uVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"Name:",5);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,(var->name_)._M_dataplus._M_p,(var->name_)._M_string_length);
  std::ios::widen((char)poVar2->_vptr_basic_ostream[-3] + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(os,"Values:",7);
  if ((var->super_Variable).values_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (var->super_Variable).values_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar3 = 8;
    uVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      poVar2 = (ostream *)std::ostream::operator<<(os,(int)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"=",1);
      pbVar1 = (var->super_Variable).values_.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar2,*(char **)((long)pbVar1 + lVar3 + -8),
                 *(long *)((long)&(pbVar1->_M_dataplus)._M_p + lVar3));
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x20;
    } while (uVar4 < (ulong)((long)(var->super_Variable).values_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(var->super_Variable).values_.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  return os;
}

Assistant:

ostream& operator<<(std::ostream& os, const NamedVar& var) {
	os << "Name:" << var.name_ << endl;
	os << "Values:";

	for (int i = 0; i < var.values_.size(); i++) {
		os << " " << i << "=" << var.values_[i];
	}
	return os;
}